

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O0

int32_t ultag_getExtensionsSize(ULanguageTag *langtag)

{
  ExtensionListEntry *local_20;
  ExtensionListEntry *cur;
  int32_t size;
  ULanguageTag *langtag_local;
  
  cur._4_4_ = 0;
  for (local_20 = langtag->extensions; local_20 != (ExtensionListEntry *)0x0;
      local_20 = local_20->next) {
    cur._4_4_ = cur._4_4_ + 1;
  }
  return cur._4_4_;
}

Assistant:

static int32_t
ultag_getExtensionsSize(const ULanguageTag* langtag) {
    int32_t size = 0;
    ExtensionListEntry *cur = langtag->extensions;
    while (TRUE) {
        if (cur == NULL) {
            break;
        }
        size++;
        cur = cur->next;
    }
    return size;
}